

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<float,float,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<float,1,-1,1,1,-1>>,3,0>
       ::run<Eigen::Matrix<float,1,_1,1,1,_1>>
                 (redux_evaluator<Eigen::Matrix<float,_1,__1,_1,_1,__1>_> *eval,
                 scalar_max_op<float,_float,_0> *func,Matrix<float,_1,__1,_1,_1,__1> *xpr)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  PacketScalar *pafVar4;
  Index index;
  long lVar5;
  long lVar6;
  Index index_1;
  long lVar7;
  float fVar8;
  Packet4f res_2;
  Packet4f res_3;
  Packet4f res;
  Packet4f res_1;
  PacketScalar afVar9;
  PacketScalar packet_res0;
  
  lVar2 = (xpr->super_PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>).m_storage.m_cols;
  lVar5 = 8;
  if (lVar2 + 3U < 7) {
    pfVar3 = (eval->super_evaluator<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>).
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>.m_d.
             data;
    fVar8 = *pfVar3;
    for (lVar5 = 1; lVar5 < lVar2; lVar5 = lVar5 + 1) {
      fVar1 = pfVar3[lVar5];
      if (fVar1 <= fVar8) {
        fVar1 = fVar8;
      }
      fVar8 = fVar1;
    }
  }
  else {
    lVar7 = (lVar2 / 4) * 4;
    pafVar4 = (PacketScalar *)
              (eval->super_evaluator<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>).
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>.m_d.
              data;
    packet_res0 = *pafVar4;
    if (7 < lVar2) {
      lVar6 = (lVar2 / 8) * 8;
      afVar9 = pafVar4[1];
      for (; lVar5 < lVar6; lVar5 = lVar5 + 8) {
        packet_res0 = (PacketScalar)
                      maxps(*(undefined1 (*) [16])(*pafVar4 + lVar5),(undefined1  [16])packet_res0);
        afVar9 = (PacketScalar)
                 maxps(*(undefined1 (*) [16])(pafVar4[1] + lVar5),(undefined1  [16])afVar9);
      }
      packet_res0 = (PacketScalar)maxps((undefined1  [16])afVar9,(undefined1  [16])packet_res0);
      if (lVar6 < lVar7) {
        packet_res0 = (PacketScalar)
                      maxps((undefined1  [16])pafVar4[(lVar2 / 8) * 2],(undefined1  [16])packet_res0
                           );
      }
    }
    fVar8 = predux_max<0,float__vector(4)>(&packet_res0);
    for (; lVar7 < lVar2; lVar7 = lVar7 + 1) {
      fVar1 = (eval->super_evaluator<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>).
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>_>.m_d.
              data[lVar7];
      if (fVar1 <= fVar8) {
        fVar1 = fVar8;
      }
      fVar8 = fVar1;
    }
  }
  return fVar8;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }